

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkMotorRotationSpeed.cpp
# Opt level: O3

void __thiscall
chrono::ChLinkMotorRotationSpeed::ArchiveIN(ChLinkMotorRotationSpeed *this,ChArchiveIn *marchive)

{
  char *local_38;
  bool *local_30;
  undefined1 local_28;
  
  ChArchiveIn::VersionRead<chrono::ChLinkMotorRotationSpeed>(marchive);
  ChLinkMotorRotation::ArchiveIN(&this->super_ChLinkMotorRotation,marchive);
  local_30 = (bool *)&(this->super_ChLinkMotorRotation).field_0x278;
  local_38 = "rot_offset";
  local_28 = 0;
  (**(code **)(*(long *)marchive + 0x20))(marchive,&local_38);
  local_30 = &this->avoid_angle_drift;
  local_38 = "avoid_angle_drift";
  local_28 = 0;
  (**(code **)(*(long *)marchive + 0x10))(marchive,&local_38);
  return;
}

Assistant:

void ChLinkMotorRotationSpeed::ArchiveIN(ChArchiveIn& marchive) {
    // version number
    /*int version =*/ marchive.VersionRead<ChLinkMotorRotationSpeed>();

    // deserialize parent class
    ChLinkMotorRotation::ArchiveIN(marchive);

    // deserialize all member data:
    marchive >> CHNVP(rot_offset);
    marchive >> CHNVP(avoid_angle_drift);
}